

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O2

void __thiscall OpenMD::RNEMD::RNEMD::writeOutputFile(RNEMD *this)

{
  ofstream *poVar1;
  double dVar2;
  pointer ppAVar3;
  long *plVar4;
  undefined1 auVar5 [16];
  RealType RVar6;
  ostream *poVar7;
  type_info *ptVar8;
  long lVar9;
  uint i;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  char *pcVar13;
  char *pcVar14;
  uint bin;
  char *pcVar15;
  ulong uVar16;
  uint uVar17;
  char *pcVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 local_118 [32];
  string message;
  vector<int,_std::allocator<int>_> nonEmptyAccumulators;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Vector3d JzL;
  Vector3d JzP;
  
  if ((this->doRNEMD_ == true) && (this->hasData_ == true)) {
    poVar1 = &this->rnemdFile_;
    std::ofstream::open((char *)poVar1,(_Ios_Openmode)(this->rnemdFileName_)._M_dataplus._M_p);
    if ((*(byte *)((long)(&this->angularMomentumFluxVector_ + 4) +
                  *(long *)(*(long *)&this->rnemdFile_ + -0x18) + 0x10) & 5) != 0) {
      snprintf(painCave.errMsg,2000,"Could not open \"%s\" for RNEMD output.\n",
               (this->rnemdFileName_)._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    RVar6 = Snapshot::getTime(this->currentSnap_);
    dVar2 = (this->areaAccumulator_).Avg_;
    Vector<double,_3U>::Vector(&JzP.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
    Vector<double,_3U>::Vector(&JzL.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
    local_118._0_16_ = ZEXT816(0);
    if ((this->info_->simParams_->Dt).data_ <= RVar6) {
      dVar2 = dVar2 * RVar6;
      auVar20._0_8_ = this->kineticExchange_ / dVar2;
      operator/((Vector<double,_3U> *)&message,&(this->momentumExchange_).super_Vector<double,_3U>,
                dVar2);
      Vector3<double>::operator=(&JzP,(Vector<double,_3U> *)&message);
      operator/((Vector<double,_3U> *)&message,
                &(this->angularMomentumExchange_).super_Vector<double,_3U>,dVar2);
      Vector3<double>::operator=(&JzL,(Vector<double,_3U> *)&message);
      auVar20._8_8_ = this->particleExchange_;
      auVar5._8_4_ = SUB84(dVar2,0);
      auVar5._0_8_ = 0x3f3b6b96510fbd0c;
      auVar5._12_4_ = (int)((ulong)dVar2 >> 0x20);
      local_118._0_16_ = divpd(auVar20,auVar5);
    }
    std::operator<<((ostream *)poVar1,"#######################################################\n");
    std::operator<<((ostream *)poVar1,"# RNEMD {\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#    exchangeMethod  = \"");
    poVar7 = std::operator<<(poVar7,(string *)&this->rnemdMethodLabel_);
    std::operator<<(poVar7,"\";\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#    fluxType  = \"");
    poVar7 = std::operator<<(poVar7,(string *)&this->rnemdFluxTypeLabel_);
    std::operator<<(poVar7,"\";\n");
    if (this->usePeriodicBoundaryConditions_ == true) {
      poVar7 = std::operator<<((ostream *)poVar1,"#    privilegedAxis = ");
      poVar7 = std::operator<<(poVar7,(string *)&this->rnemdAxisLabel_);
      std::operator<<(poVar7,";\n");
    }
    std::operator<<((ostream *)poVar1,"#    exchangeTime = ");
    poVar7 = std::ostream::_M_insert<double>(this->exchangeTime_);
    std::operator<<(poVar7,";\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#    objectSelection = \"");
    poVar7 = std::operator<<(poVar7,(string *)&this->rnemdObjectSelection_);
    std::operator<<(poVar7,"\";\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#    selectionA = \"");
    poVar7 = std::operator<<(poVar7,(string *)&this->selectionA_);
    std::operator<<(poVar7,"\";\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#    selectionB = \"");
    poVar7 = std::operator<<(poVar7,(string *)&this->selectionB_);
    std::operator<<(poVar7,"\";\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#    outputSelection = \"");
    poVar7 = std::operator<<(poVar7,(string *)&this->outputSelection_);
    std::operator<<(poVar7,"\";\n");
    std::operator<<((ostream *)poVar1,"# }\n");
    std::operator<<((ostream *)poVar1,"#######################################################\n");
    std::operator<<((ostream *)poVar1,"# RNEMD report:\n");
    std::operator<<((ostream *)poVar1,"#      running time = ");
    poVar7 = std::ostream::_M_insert<double>(RVar6);
    std::operator<<(poVar7," fs\n");
    std::operator<<((ostream *)poVar1,"# Target flux:\n");
    std::operator<<((ostream *)poVar1,"#           kinetic = ");
    poVar7 = std::ostream::_M_insert<double>(this->kineticFlux_ / 0.0004184);
    std::operator<<(poVar7," (kcal/mol/A^2/fs)\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#          momentum = ");
    poVar7 = OpenMD::operator<<(poVar7,&(this->momentumFluxVector_).super_Vector<double,_3U>);
    std::operator<<(poVar7," (amu/A/fs^2)\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#  angular momentum = ");
    poVar7 = OpenMD::operator<<(poVar7,&(this->angularMomentumFluxVector_).super_Vector<double,_3U>)
    ;
    std::operator<<(poVar7," (amu/A^2/fs^2)\n");
    pcVar13 = "#          particle = ";
    bVar19 = this->useChargedSPF_ != false;
    pcVar14 = "#          particle = ";
    if (bVar19) {
      pcVar14 = "#   current density = ";
    }
    pcVar15 = " (particles/A^2/fs)\n";
    pcVar10 = " (particles/A^2/fs)\n";
    if (bVar19) {
      pcVar10 = " (electrons/A^2/fs)\n";
    }
    std::operator<<((ostream *)poVar1,pcVar14);
    poVar7 = std::ostream::_M_insert<double>(this->particleFlux_);
    std::operator<<(poVar7,pcVar10);
    std::operator<<((ostream *)poVar1,"# Target one-time exchanges:\n");
    std::operator<<((ostream *)poVar1,"#          kinetic = ");
    poVar7 = std::ostream::_M_insert<double>(this->kineticTarget_ / 0.0004184);
    std::operator<<(poVar7," (kcal/mol)\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#          momentum = ");
    poVar7 = OpenMD::operator<<(poVar7,&(this->momentumTarget_).super_Vector<double,_3U>);
    std::operator<<(poVar7," (amu*A/fs)\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#  angular momentum = ");
    poVar7 = OpenMD::operator<<(poVar7,&(this->angularMomentumTarget_).super_Vector<double,_3U>);
    std::operator<<(poVar7," (amu*A^2/fs)\n");
    bVar19 = this->useChargedSPF_ != false;
    pcVar14 = "#          particle = ";
    if (bVar19) {
      pcVar14 = "#   current density = ";
    }
    pcVar18 = " (particles)\n";
    pcVar10 = " (particles)\n";
    if (bVar19) {
      pcVar10 = " (electrons)\n";
    }
    std::operator<<((ostream *)poVar1,pcVar14);
    poVar7 = std::ostream::_M_insert<double>(this->particleTarget_);
    std::operator<<(poVar7,pcVar10);
    std::operator<<((ostream *)poVar1,"# Actual exchange totals:\n");
    std::operator<<((ostream *)poVar1,"#          kinetic = ");
    poVar7 = std::ostream::_M_insert<double>(this->kineticExchange_ / 0.0004184);
    std::operator<<(poVar7," (kcal/mol)\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#          momentum = ");
    poVar7 = OpenMD::operator<<(poVar7,&(this->momentumExchange_).super_Vector<double,_3U>);
    std::operator<<(poVar7," (amu*A/fs)\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#  angular momentum = ");
    poVar7 = OpenMD::operator<<(poVar7,&(this->angularMomentumExchange_).super_Vector<double,_3U>);
    std::operator<<(poVar7," (amu*A^2/fs)\n");
    pcVar14 = "#          particle = ";
    if (this->useChargedSPF_ != false) {
      pcVar14 = "#   current density = ";
      pcVar18 = " (electrons)\n";
    }
    std::operator<<((ostream *)poVar1,pcVar14);
    poVar7 = std::ostream::_M_insert<double>(this->particleExchange_);
    std::operator<<(poVar7,pcVar18);
    std::operator<<((ostream *)poVar1,"# Actual flux:\n");
    std::operator<<((ostream *)poVar1,"#          kinetic = ");
    poVar7 = std::ostream::_M_insert<double>((double)local_118._0_8_);
    std::operator<<(poVar7," (kcal/mol/A^2/fs)\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#          momentum = ");
    poVar7 = OpenMD::operator<<(poVar7,&JzP.super_Vector<double,_3U>);
    std::operator<<(poVar7," (amu/A/fs^2)\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#  angular momentum = ");
    poVar7 = OpenMD::operator<<(poVar7,&JzL.super_Vector<double,_3U>);
    std::operator<<(poVar7," (amu/A^2/fs^2)\n");
    if (this->useChargedSPF_ != false) {
      pcVar13 = "#   current density = ";
      pcVar15 = " (electrons/A^2/fs)\n";
    }
    std::operator<<((ostream *)poVar1,pcVar13);
    poVar7 = std::ostream::_M_insert<double>((double)local_118._8_8_);
    std::operator<<(poVar7,pcVar15);
    std::operator<<((ostream *)poVar1,"# Exchange statistics:\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#               attempted = ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)poVar1,"#                  failed = ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7,"\n");
    bVar19 = std::operator==(&this->rnemdMethodLabel_,"NIVS");
    if (bVar19) {
      poVar7 = std::operator<<((ostream *)poVar1,"#  NIVS root-check errors = ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::operator<<(poVar7,"\n");
    }
    std::operator<<((ostream *)poVar1,"#######################################################\n");
    std::operator<<((ostream *)poVar1,"#");
    for (uVar11 = 0; uVar11 != 9; uVar11 = uVar11 + 1) {
      if (((this->outputMask_).super__Base_bitset<1UL>._M_w >> (uVar11 & 0x3f) & 1) != 0) {
        poVar7 = std::operator<<((ostream *)poVar1,"\t");
        poVar7 = std::operator<<(poVar7,(string *)
                                        ((this->data_).
                                         super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar11));
        poVar7 = std::operator<<(poVar7,"(");
        poVar7 = std::operator<<(poVar7,(string *)
                                        &(this->data_).
                                         super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar11].units);
        std::operator<<(poVar7,")");
        ptVar8 = (type_info *)
                 (**(code **)(*(long *)**(undefined8 **)
                                         &(this->data_).
                                          super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                          accumulator.
                                          super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                          ._M_impl + 0x38))();
        bVar19 = std::type_info::operator==(ptVar8,(type_info *)&Vector3<double>::typeinfo);
        if (bVar19) {
          std::operator<<((ostream *)poVar1,"\t\t");
        }
        ptVar8 = (type_info *)
                 (**(code **)(*(long *)**(undefined8 **)
                                         &(this->data_).
                                          super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                          accumulator.
                                          super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                          ._M_impl + 0x38))();
        bVar19 = std::type_info::operator==
                           (ptVar8,(type_info *)
                                   &std::vector<double,std::allocator<double>>::typeinfo);
        if (bVar19) {
          std::operator<<((ostream *)poVar1,"(");
          uVar17 = 0;
          while( true ) {
            ppAVar3 = (this->outputTypes_).
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->outputTypes_).
                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar3 >> 3) <=
                (ulong)uVar17) break;
            AtomType::getName_abi_cxx11_(&message,ppAVar3[uVar17]);
            poVar7 = std::operator<<((ostream *)poVar1,(string *)&message);
            std::operator<<(poVar7,"\t");
            std::__cxx11::string::~string((string *)&message);
            uVar17 = uVar17 + 1;
          }
          std::operator<<((ostream *)poVar1,")\t");
        }
      }
    }
    std::operator<<((ostream *)poVar1,'\n');
    std::vector<int,_std::allocator<int>_>::vector
              (&nonEmptyAccumulators,(ulong)this->nBins_,(allocator_type *)&message);
    iVar12 = 0;
    for (uVar11 = 0; uVar11 != 9; uVar11 = uVar11 + 1) {
      if (((this->outputMask_).super__Base_bitset<1UL>._M_w >> (uVar11 & 0x3f) & 1) != 0) {
        for (uVar16 = 0; uVar16 < this->nBins_; uVar16 = uVar16 + 1) {
          lVar9 = (**(code **)(**(long **)(*(long *)&(this->data_).
                                                                                                          
                                                  super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                                  accumulator.
                                                  super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                                  ._M_impl + uVar16 * 8) + 0x40))();
          nonEmptyAccumulators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16] =
               (nonEmptyAccumulators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16] + 1) - (uint)(lVar9 == 0);
        }
        iVar12 = iVar12 + 1;
      }
    }
    *(undefined8 *)
     ((long)(&this->angularMomentumFluxVector_ + 3) + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 8
    ;
    for (uVar11 = 0; uVar11 < this->nBins_; uVar11 = uVar11 + 1) {
      if (nonEmptyAccumulators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] == iVar12) {
        lVar9 = 0;
        for (uVar16 = 0; uVar16 != 9; uVar16 = uVar16 + 1) {
          if (((this->outputMask_).super__Base_bitset<1UL>._M_w >> (uVar16 & 0x3f) & 1) != 0) {
            std::operator+(&local_c0,"RNEMD detected a numerical error writing: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(((this->data_).
                                     super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->title)._M_dataplus.
                                   _M_p + lVar9));
            std::operator+(&local_80,&local_c0," for bin ");
            std::__cxx11::to_string(&local_a0,(uint)uVar11);
            std::operator+(&message,&local_80,&local_a0);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&local_c0);
            plVar4 = *(long **)(*(long *)((long)&(((this->data_).
                                                                                                      
                                                  super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 accumulator).
                                                 super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                                 ._M_impl + lVar9) + uVar11 * 8);
            (**(code **)(*plVar4 + 0x48))(plVar4,poVar1,&message,0);
            std::__cxx11::string::~string((string *)&message);
          }
          lVar9 = lVar9 + 0x58;
        }
        std::operator<<((ostream *)poVar1,'\n');
      }
    }
    std::operator<<((ostream *)poVar1,"#######################################################\n");
    std::operator<<((ostream *)poVar1,"# 95% confidence intervals in those quantities follow:\n");
    std::operator<<((ostream *)poVar1,"#######################################################\n");
    for (uVar11 = 0; uVar11 < this->nBins_; uVar11 = uVar11 + 1) {
      if (nonEmptyAccumulators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] == iVar12) {
        std::operator<<((ostream *)poVar1,"#");
        lVar9 = 0;
        for (uVar16 = 0; uVar16 != 9; uVar16 = uVar16 + 1) {
          if (((this->outputMask_).super__Base_bitset<1UL>._M_w >> (uVar16 & 0x3f) & 1) != 0) {
            std::operator+(&local_c0,"RNEMD detected a numerical error writing: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(((this->data_).
                                     super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->title)._M_dataplus.
                                   _M_p + lVar9));
            std::operator+(&local_80,&local_c0," std. dev. for bin ");
            std::__cxx11::to_string(&local_a0,(uint)uVar11);
            std::operator+(&message,&local_80,&local_a0);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&local_c0);
            plVar4 = *(long **)(*(long *)((long)&(((this->data_).
                                                                                                      
                                                  super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 accumulator).
                                                 super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                                 ._M_impl + lVar9) + uVar11 * 8);
            (**(code **)(*plVar4 + 0x50))(plVar4,poVar1,&message,0);
            std::__cxx11::string::~string((string *)&message);
          }
          lVar9 = lVar9 + 0x58;
        }
        std::operator<<((ostream *)poVar1,'\n');
      }
    }
    std::ostream::flush();
    std::ofstream::close();
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&nonEmptyAccumulators.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void RNEMD::writeOutputFile() {
    if (!doRNEMD_) return;
    if (!hasData_) return;

#ifdef IS_MPI
    // If we're the primary node, should we print out the results
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);

    if (worldRank == 0) {
#endif
      rnemdFile_.open(rnemdFileName_.c_str(), std::ios::out | std::ios::trunc);

      if (!rnemdFile_) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Could not open \"%s\" for RNEMD output.\n",
                 rnemdFileName_.c_str());
        painCave.isFatal = 1;
        simError();
      }

      RealType time    = currentSnap_->getTime();
      RealType avgArea = areaAccumulator_.getAverage();

      RealType Jz(0.0);
      Vector3d JzP(V3Zero);
      Vector3d JzL(V3Zero);
      RealType Jpart(0.0);

      if (time >= info_->getSimParams()->getDt()) {
        Jz    = kineticExchange_ / (time * avgArea) / Constants::energyConvert;
        JzP   = momentumExchange_ / (time * avgArea);
        JzL   = angularMomentumExchange_ / (time * avgArea);
        Jpart = particleExchange_ / (time * avgArea);
      }

      rnemdFile_ << "#######################################################\n";
      rnemdFile_ << "# RNEMD {\n";
      rnemdFile_ << "#    exchangeMethod  = \"" << rnemdMethodLabel_ << "\";\n";
      rnemdFile_ << "#    fluxType  = \"" << rnemdFluxTypeLabel_ << "\";\n";

      if (usePeriodicBoundaryConditions_)
        rnemdFile_ << "#    privilegedAxis = " << rnemdAxisLabel_ << ";\n";

      rnemdFile_ << "#    exchangeTime = " << exchangeTime_ << ";\n";
      rnemdFile_ << "#    objectSelection = \"" << rnemdObjectSelection_
                 << "\";\n";
      rnemdFile_ << "#    selectionA = \"" << selectionA_ << "\";\n";
      rnemdFile_ << "#    selectionB = \"" << selectionB_ << "\";\n";
      rnemdFile_ << "#    outputSelection = \"" << outputSelection_ << "\";\n";
      rnemdFile_ << "# }\n";
      rnemdFile_ << "#######################################################\n";
      rnemdFile_ << "# RNEMD report:\n";
      rnemdFile_ << "#      running time = " << time << " fs\n";
      rnemdFile_ << "# Target flux:\n";
      rnemdFile_ << "#           kinetic = "
                 << kineticFlux_ / Constants::energyConvert
                 << " (kcal/mol/A^2/fs)\n";
      rnemdFile_ << "#          momentum = " << momentumFluxVector_
                 << " (amu/A/fs^2)\n";
      rnemdFile_ << "#  angular momentum = " << angularMomentumFluxVector_
                 << " (amu/A^2/fs^2)\n";
      if (useChargedSPF_) {
        rnemdFile_ << "#   current density = " << particleFlux_
                   << " (electrons/A^2/fs)\n";
      } else {
        rnemdFile_ << "#          particle = " << particleFlux_
                   << " (particles/A^2/fs)\n";
      }

      rnemdFile_ << "# Target one-time exchanges:\n";
      rnemdFile_ << "#          kinetic = "
                 << kineticTarget_ / Constants::energyConvert
                 << " (kcal/mol)\n";
      rnemdFile_ << "#          momentum = " << momentumTarget_
                 << " (amu*A/fs)\n";
      rnemdFile_ << "#  angular momentum = " << angularMomentumTarget_
                 << " (amu*A^2/fs)\n";
      if (useChargedSPF_) {
        rnemdFile_ << "#   current density = " << particleTarget_
                   << " (electrons)\n";
      } else {
        rnemdFile_ << "#          particle = " << particleTarget_
                   << " (particles)\n";
      }

      rnemdFile_ << "# Actual exchange totals:\n";
      rnemdFile_ << "#          kinetic = "
                 << kineticExchange_ / Constants::energyConvert
                 << " (kcal/mol)\n";
      rnemdFile_ << "#          momentum = " << momentumExchange_
                 << " (amu*A/fs)\n";
      rnemdFile_ << "#  angular momentum = " << angularMomentumExchange_
                 << " (amu*A^2/fs)\n";
      if (useChargedSPF_) {
        rnemdFile_ << "#   current density = " << particleExchange_
                   << " (electrons)\n";
      } else {
        rnemdFile_ << "#          particle = " << particleExchange_
                   << " (particles)\n";
      }

      rnemdFile_ << "# Actual flux:\n";
      rnemdFile_ << "#          kinetic = " << Jz << " (kcal/mol/A^2/fs)\n";
      rnemdFile_ << "#          momentum = " << JzP << " (amu/A/fs^2)\n";
      rnemdFile_ << "#  angular momentum = " << JzL << " (amu/A^2/fs^2)\n";
      if (useChargedSPF_) {
        rnemdFile_ << "#   current density = " << Jpart
                   << " (electrons/A^2/fs)\n";
      } else {
        rnemdFile_ << "#          particle = " << Jpart
                   << " (particles/A^2/fs)\n";
      }

      rnemdFile_ << "# Exchange statistics:\n";
      rnemdFile_ << "#               attempted = " << trialCount_ << "\n";
      rnemdFile_ << "#                  failed = " << failTrialCount_ << "\n";
      if (rnemdMethodLabel_ == "NIVS") {
        rnemdFile_ << "#  NIVS root-check errors = " << failRootCount_ << "\n";
      }
      rnemdFile_ << "#######################################################\n";

      // write title
      rnemdFile_ << "#";
      for (unsigned int i = 0; i < outputMask_.size(); ++i) {
        if (outputMask_[i]) {
          rnemdFile_ << "\t" << data_[i].title << "(" << data_[i].units << ")";

          // add some extra tabs for column alignment
          if (data_[i].accumulator[0]->getType() ==
              std::type_index(typeid(Vector3d))) {
            rnemdFile_ << "\t\t";
          }

          if (data_[i].accumulator[0]->getType() ==
              std::type_index(typeid(std::vector<RealType>))) {
            rnemdFile_ << "(";
            for (unsigned int type = 0; type < outputTypes_.size(); type++) {
              rnemdFile_ << outputTypes_[type]->getName() << "\t";
            }
            rnemdFile_ << ")\t";
          }
        }
      }

      rnemdFile_ << '\n';

      std::vector<int> nonEmptyAccumulators(nBins_);
      int numberOfAccumulators {};

      for (unsigned int i = 0; i < outputMask_.size(); ++i) {
        if (outputMask_[i]) {
          for (unsigned int bin = 0; bin < nBins_; bin++) {
            nonEmptyAccumulators[bin] +=
                static_cast<int>(data_[i].accumulator[bin]->getCount() != 0);
          }

          numberOfAccumulators++;
        }
      }

      rnemdFile_.precision(8);

      for (unsigned int bin = 0; bin < nBins_; bin++) {
        if (nonEmptyAccumulators[bin] == numberOfAccumulators) {
          for (unsigned int i = 0; i < outputMask_.size(); ++i) {
            if (outputMask_[i]) {
              std::string message =
                  "RNEMD detected a numerical error writing: " +
                  data_[i].title + " for bin " + std::to_string(bin);

              data_[i].accumulator[bin]->writeData(rnemdFile_, message);
            }
          }

          rnemdFile_ << '\n';
        }
      }

      rnemdFile_ << "#######################################################\n";
      rnemdFile_ << "# 95% confidence intervals in those quantities follow:\n";
      rnemdFile_ << "#######################################################\n";

      for (unsigned int bin = 0; bin < nBins_; bin++) {
        if (nonEmptyAccumulators[bin] == numberOfAccumulators) {
          rnemdFile_ << "#";

          for (unsigned int i = 0; i < outputMask_.size(); ++i) {
            if (outputMask_[i]) {
              std::string message =
                  "RNEMD detected a numerical error writing: " +
                  data_[i].title + " std. dev. for bin " + std::to_string(bin);

              data_[i].accumulator[bin]->writeErrorBars(rnemdFile_, message);
            }
          }

          rnemdFile_ << '\n';
        }
      }

      rnemdFile_.flush();
      rnemdFile_.close();
#ifdef IS_MPI
    }
#endif
  }

  void RNEMD::setKineticFlux(RealType kineticFlux) {
    // convert the kcal / mol / Angstroms^2 / fs values in the md file
    // into  amu / fs^3:
    kineticFlux_ = kineticFlux * Constants::energyConvert;
  }

  void RNEMD::setParticleFlux(RealType particleFlux) {
    RealType area = getDefaultDividingArea();

    particleFlux_   = particleFlux;
    particleTarget_ = particleFlux_ * exchangeTime_ * area;
  }

  void RNEMD::setMomentumFluxVector(
      const std::vector<RealType>& momentumFluxVector) {
    if (momentumFluxVector.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: Incorrect number of parameters specified for "
               "momentumFluxVector.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               momentumFluxVector.size());
      painCave.isFatal = 1;
      simError();
    }

    momentumFluxVector_.x() = momentumFluxVector[0];
    momentumFluxVector_.y() = momentumFluxVector[1];
    momentumFluxVector_.z() = momentumFluxVector[2];
  }

  void RNEMD::setAngularMomentumFluxVector(
      const std::vector<RealType>& angularMomentumFluxVector) {
    if (angularMomentumFluxVector.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: Incorrect number of parameters specified for "
               "angularMomentumFluxVector.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               angularMomentumFluxVector.size());
      painCave.isFatal = 1;
      simError();
    }

    angularMomentumFluxVector_.x() = angularMomentumFluxVector[0];
    angularMomentumFluxVector_.y() = angularMomentumFluxVector[1];
    angularMomentumFluxVector_.z() = angularMomentumFluxVector[2];
  }

  void RNEMD::parseOutputFileFormat(const std::string& format) {
    if (!doRNEMD_) return;
    StringTokenizer tokenizer(format, " ,;|\t\n\r");

    while (tokenizer.hasMoreTokens()) {
      std::string token(tokenizer.nextToken());
      toUpper(token);
      OutputMapType::iterator i = outputMap_.find(token);
      if (i != outputMap_.end()) {
        outputMask_.set(i->second);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::parseOutputFileFormat: %s is not a recognized\n"
                 "\toutputFileFormat keyword.\n",
                 token.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_ERROR;
        simError();
      }
    }
  }

  std::string RNEMD::setSelection(RealType& slabCenter) {
    bool printSlabCenterWarning {false};

    Vector3d tempSlabCenter {V3Zero};
    tempSlabCenter[rnemdPrivilegedAxis_] = slabCenter;

    RealType hmat_2 = hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) / 2.0;

    if (slabCenter > hmat_2) {
      currentSnap_->wrapVector(tempSlabCenter);
      printSlabCenterWarning = true;
    } else if (slabCenter < -hmat_2) {
      currentSnap_->wrapVector(tempSlabCenter);
      printSlabCenterWarning = true;
    }

    if (printSlabCenterWarning) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "The given slab center was set to %0.2f. In the wrapped "
               "coordinates\n"
               "\t[-Hmat/2, +Hmat/2], this has been remapped to %0.2f.\n",
               slabCenter, tempSlabCenter[rnemdPrivilegedAxis_]);
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_WARNING;
      simError();

      slabCenter = tempSlabCenter[rnemdPrivilegedAxis_];
    }

    Vector3d leftSlab {V3Zero};
    const RealType& leftSlabBoundary = leftSlab[rnemdPrivilegedAxis_];
    leftSlab[rnemdPrivilegedAxis_]   = slabCenter - 0.5 * slabWidth_;
    currentSnap_->wrapVector(leftSlab);

    Vector3d rightSlab {V3Zero};
    const RealType& rightSlabBoundary = rightSlab[rnemdPrivilegedAxis_];
    rightSlab[rnemdPrivilegedAxis_]   = slabCenter + 0.5 * slabWidth_;
    currentSnap_->wrapVector(rightSlab);

    std::ostringstream selectionStream;

    selectionStream << "select wrapped" << rnemdAxisLabel_
                    << " >= " << leftSlabBoundary;

    if (leftSlabBoundary > rightSlabBoundary)
      selectionStream << " || wrapped" << rnemdAxisLabel_ << " < "
                      << rightSlabBoundary;
    else
      selectionStream << " && wrapped" << rnemdAxisLabel_ << " < "
                      << rightSlabBoundary;

    return selectionStream.str();
  }

  RealType RNEMD::getDefaultDividingArea() {
    if (hasDividingArea_) return dividingArea_;

    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (hasSelectionA_) {
      if (evaluatorA_.hasSurfaceArea()) {
        areaA_   = evaluatorA_.getSurfaceArea();
        volumeA_ = evaluatorA_.getVolume();
      } else {
        int isd;
        StuntDouble* sd;
        std::vector<StuntDouble*> aSites;
        seleManA_.setSelectionSet(evaluatorA_.evaluate());
        for (sd = seleManA_.beginSelected(isd); sd != NULL;
             sd = seleManA_.nextSelected(isd)) {
          aSites.push_back(sd);
        }
#if defined(HAVE_QHULL)
        ConvexHull* surfaceMeshA = new ConvexHull();
        surfaceMeshA->computeHull(aSites);
        areaA_   = surfaceMeshA->getArea();
        volumeA_ = surfaceMeshA->getVolume();
        delete surfaceMeshA;
#else
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::getDividingArea : Hull calculation is not possible\n"
                 "\twithout libqhull. Please rebuild OpenMD with qhull "
                 "enabled.");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
#endif
      }
    } else {
      if (usePeriodicBoundaryConditions_) {
        // in periodic boundaries, the surface area is twice the
        // area of the current box, normal to the privileged axis:
        switch (rnemdPrivilegedAxis_) {
        case rnemdX:
          areaA_ = 2.0 * snap->getYZarea();
          break;
        case rnemdY:
          areaA_ = 2.0 * snap->getXZarea();
          break;
        case rnemdZ:
        default:
          areaA_ = 2.0 * snap->getXYarea();
        }

        volumeA_ = areaA_ * slabWidth_;
      } else {
        // in non-periodic simulations, without explicitly setting
        // selections, the sphere radius sets the surface area of the
        // dividing surface:
        areaA_   = 4.0 * Constants::PI * std::pow(sphereARadius_, 2);
        volumeA_ = 4.0 * Constants::PI * std::pow(sphereARadius_, 3) / 3.0;
      }
    }

    if (hasSelectionB_) {
      if (evaluatorB_.hasSurfaceArea()) {
        areaB_   = evaluatorB_.getSurfaceArea();
        volumeB_ = evaluatorB_.getVolume();
      } else {
        int isd;
        StuntDouble* sd;
        std::vector<StuntDouble*> bSites;
        seleManB_.setSelectionSet(evaluatorB_.evaluate());
        for (sd = seleManB_.beginSelected(isd); sd != NULL;
             sd = seleManB_.nextSelected(isd)) {
          bSites.push_back(sd);
        }

#if defined(HAVE_QHULL)
        ConvexHull* surfaceMeshB = new ConvexHull();
        surfaceMeshB->computeHull(bSites);
        areaB_   = surfaceMeshB->getArea();
        volumeB_ = surfaceMeshB->getVolume();
        delete surfaceMeshB;
#else
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::getDividingArea : Hull calculation is not possible\n"
                 "\twithout libqhull. Please rebuild OpenMD with qhull "
                 "enabled.");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
#endif
      }
    } else {
      if (usePeriodicBoundaryConditions_) {
        // in periodic boundaries, the surface area is twice the
        // area of the current box, normal to the privileged axis:
        switch (rnemdPrivilegedAxis_) {
        case rnemdX:
          areaB_ = 2.0 * snap->getYZarea();
          break;
        case rnemdY:
          areaB_ = 2.0 * snap->getXZarea();
          break;
        case rnemdZ:
        default:
          areaB_ = 2.0 * snap->getXYarea();
        }

        volumeB_ = areaB_ * slabWidth_;
      } else {
        // in non-periodic simulations, without explicitly setting
        // selections, but if a sphereBradius has been set, just use that:
        areaB_ = 4.0 * Constants::PI * pow(sphereBRadius_, 2);
        Thermo thermo(info_);
        RealType hVol = thermo.getHullVolume();
        volumeB_ = hVol - 4.0 * Constants::PI * pow(sphereBRadius_, 3) / 3.0;
      }
    }

    dividingArea_    = min(areaA_, areaB_);
    hasDividingArea_ = true;
    return dividingArea_;
  }

  int RNEMD::getBin(Vector3d pos) {
    if (usePeriodicBoundaryConditions_) {
      currentSnap_->wrapVector(pos);

      return int(nBins_ *
                 (pos[rnemdPrivilegedAxis_] /
                      hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) +
                  0.5)) %
             nBins_;
    } else {
      Vector3d rPos = pos - coordinateOrigin_;
      return int(rPos.length() / binWidth_);
    }
  }
}